

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-database_records_shape.c
# Opt level: O0

void CGTFS_DatabaseShape(void)

{
  int iVar1;
  greatest_test_res local_c;
  greatest_test_res res;
  
  iVar1 = greatest_test_pre("db_shape_store");
  if (iVar1 == 1) {
    local_c = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_c == GREATEST_TEST_RES_PASS) {
      local_c = db_shape_store();
    }
    greatest_test_post(local_c);
  }
  return;
}

Assistant:

SUITE(CGTFS_DatabaseShape) {
    RUN_TEST(db_shape_store);
}